

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O0

void __thiscall
cmParseJacocoCoverage::XMLParser::XMLParser
          (XMLParser *this,cmCTest *ctest,cmCTestCoverageHandlerContainer *cont)

{
  cmCTestCoverageHandlerContainer *cont_local;
  cmCTest *ctest_local;
  XMLParser *this_local;
  
  cmXMLParser::cmXMLParser(&this->super_cmXMLParser);
  (this->super_cmXMLParser)._vptr_cmXMLParser = (_func_int **)&PTR__XMLParser_00b86750;
  std::__cxx11::string::string((string *)&this->FilePath);
  std::__cxx11::string::string((string *)&this->PackagePath);
  std::__cxx11::string::string((string *)&this->PackageName);
  this->CTest = ctest;
  this->Coverage = cont;
  return;
}

Assistant:

XMLParser(cmCTest* ctest, cmCTestCoverageHandlerContainer& cont)
    : CTest(ctest)
    , Coverage(cont)
  {
  }